

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

void destroy_dmr_C(dmr_C *C)

{
  dmrC_destroy_all_scopes(C);
  dmrC_destroy_tokenizer(C);
  dmrC_destroy_target(C);
  dmrC_destroy_symbols(C);
  dmrC_destroy_linearizer(C);
  dmrC_allocator_destroy(&C->token_allocator);
  dmrC_allocator_destroy(&C->protected_token_allocator);
  dmrC_allocator_destroy(&C->string_allocator);
  dmrC_allocator_destroy(&C->ident_allocator);
  dmrC_allocator_destroy(&C->byte_allocator);
  dmrC_allocator_destroy(&C->scope_allocator);
  dmrC_allocator_destroy(&C->expression_allocator);
  dmrC_allocator_destroy(&C->statement_allocator);
  dmrC_allocator_destroy(&C->ptrlist_allocator);
  free(C);
  return;
}

Assistant:

void destroy_dmr_C(struct dmr_C *C)
{
	dmrC_destroy_all_scopes(C);
	dmrC_destroy_tokenizer(C);
	dmrC_destroy_target(C);
	dmrC_destroy_symbols(C);
#if !defined(PARSER_ONLY)
	dmrC_destroy_linearizer(C);
#endif
	dmrC_allocator_destroy(&C->token_allocator);
	dmrC_allocator_destroy(&C->protected_token_allocator);
	dmrC_allocator_destroy(&C->string_allocator);
	dmrC_allocator_destroy(&C->ident_allocator);
	dmrC_allocator_destroy(&C->byte_allocator);
	dmrC_allocator_destroy(&C->scope_allocator);
	dmrC_allocator_destroy(&C->expression_allocator);
	dmrC_allocator_destroy(&C->statement_allocator);
	dmrC_allocator_destroy(&C->ptrlist_allocator);
	free(C);
}